

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ComputeCumulativeSumRow_C(uint8_t *row,int32_t *cumsum,int32_t *previous_cumsum,int width)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  iVar3 = 0;
  iVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
  for (; uVar2 * 4 != uVar1; uVar1 = uVar1 + 4) {
    iVar3 = iVar3 + (uint)row[uVar1];
    iVar4 = iVar4 + (uint)row[uVar1 + 1];
    iVar5 = iVar5 + (uint)row[uVar1 + 2];
    iVar6 = iVar6 + (uint)row[uVar1 + 3];
    cumsum[uVar1] = previous_cumsum[uVar1] + iVar3;
    cumsum[uVar1 + 1] = previous_cumsum[uVar1 + 1] + iVar4;
    cumsum[uVar1 + 2] = previous_cumsum[uVar1 + 2] + iVar5;
    cumsum[uVar1 + 3] = previous_cumsum[uVar1 + 3] + iVar6;
  }
  return;
}

Assistant:

void ComputeCumulativeSumRow_C(const uint8_t* row,
                               int32_t* cumsum,
                               const int32_t* previous_cumsum,
                               int width) {
  int32_t row_sum[4] = {0, 0, 0, 0};
  int x;
  for (x = 0; x < width; ++x) {
    row_sum[0] += row[x * 4 + 0];
    row_sum[1] += row[x * 4 + 1];
    row_sum[2] += row[x * 4 + 2];
    row_sum[3] += row[x * 4 + 3];
    cumsum[x * 4 + 0] = row_sum[0] + previous_cumsum[x * 4 + 0];
    cumsum[x * 4 + 1] = row_sum[1] + previous_cumsum[x * 4 + 1];
    cumsum[x * 4 + 2] = row_sum[2] + previous_cumsum[x * 4 + 2];
    cumsum[x * 4 + 3] = row_sum[3] + previous_cumsum[x * 4 + 3];
  }
}